

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29469b::CommandLineParser::registerSubCommand
          (CommandLineParser *this,SubCommand *sub)

{
  uint *puVar1;
  ushort uVar2;
  size_t __n;
  StringMapEntryBase **ppSVar3;
  Option *Opt;
  void **ppvVar4;
  void **ppvVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  StringMapEntryBase *pSVar9;
  uint *puVar10;
  long lVar11;
  StringMapEntryBase **ppSVar12;
  bool bVar13;
  StringRef Name;
  pair<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>,_bool> local_50;
  void **local_38;
  
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  puVar1 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
            super_SmallPtrSetImplBase.NumNonEmpty;
  puVar10 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
             super_SmallPtrSetImplBase.CurArraySize;
  puVar7 = puVar10;
  if (local_50.first.super_SmallPtrSetIteratorImpl.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar7 = puVar1;
  }
  local_50.first.super_SmallPtrSetIteratorImpl.End =
       local_50.first.super_SmallPtrSetIteratorImpl.Bucket + *puVar7;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
  ppvVar4 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_38 = local_50.first.super_SmallPtrSetIteratorImpl.End;
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  if (local_50.first.super_SmallPtrSetIteratorImpl.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar10 = puVar1;
  }
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket =
       local_50.first.super_SmallPtrSetIteratorImpl.Bucket + *puVar10;
  local_50.first.super_SmallPtrSetIteratorImpl.End =
       local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
  ppvVar5 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_50.first.super_SmallPtrSetIteratorImpl.End = local_38;
  bVar13 = ppvVar4 != local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
  local_50.first.super_SmallPtrSetIteratorImpl.Bucket = ppvVar4;
  if (bVar13) {
    lVar11 = 0;
    do {
      ppvVar4 = local_50.first.super_SmallPtrSetIteratorImpl.Bucket;
      if (local_50.first.super_SmallPtrSetIteratorImpl.End <=
          local_50.first.super_SmallPtrSetIteratorImpl.Bucket) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      __n = (sub->Name).Length;
      if ((__n != 0) &&
         (*(size_t *)((long)*local_50.first.super_SmallPtrSetIteratorImpl.Bucket + 8) == __n)) {
        iVar6 = bcmp(**local_50.first.super_SmallPtrSetIteratorImpl.Bucket,(sub->Name).Data,__n);
        lVar11 = lVar11 + (ulong)(iVar6 == 0);
      }
      local_50.first.super_SmallPtrSetIteratorImpl.Bucket = ppvVar4 + 1;
      llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_50);
    } while (local_50.first.super_SmallPtrSetIteratorImpl.Bucket != ppvVar5);
    if (lVar11 != 0) {
      __assert_fail("count_if(RegisteredSubCommands, [sub](const SubCommand *Sub) { return (!sub->getName().empty()) && (Sub->getName() == sub->getName()); }) == 0 && \"Duplicate subcommands\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                    ,0x125,
                    "void (anonymous namespace)::CommandLineParser::registerSubCommand(SubCommand *)"
                   );
    }
  }
  llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::insert
            (&local_50,&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>,
             sub);
  if (llvm::cl::AllSubCommands == (SubCommand *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::AllSubCommands,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  if (llvm::cl::AllSubCommands != sub) {
    if (llvm::cl::AllSubCommands == (SubCommand *)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&llvm::cl::AllSubCommands,
                 llvm::object_creator<llvm::cl::SubCommand>::call,
                 llvm::object_deleter<llvm::cl::SubCommand>::call);
    }
    ppSVar3 = (llvm::cl::AllSubCommands->OptionsMap).super_StringMapImpl.TheTable;
    uVar8 = (ulong)(llvm::cl::AllSubCommands->OptionsMap).super_StringMapImpl.NumBuckets;
    ppSVar12 = ppSVar3;
    if (uVar8 != 0) {
      for (; (*ppSVar12 == (StringMapEntryBase *)0x0 ||
             (*ppSVar12 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar12 = ppSVar12 + 1) {
      }
    }
    if (ppSVar12 != ppSVar3 + uVar8) {
      pSVar9 = *ppSVar12;
      do {
        Opt = (Option *)pSVar9[1].StrLen;
        uVar2 = *(ushort *)&Opt->field_0xc;
        if (((((uVar2 & 7) == 4) || ((uVar2 & 0x180) == 0x80)) || ((uVar2 & 0x800) != 0)) ||
           ((Opt->ArgStr).Length != 0)) {
          addOption(this,Opt,sub);
        }
        else {
          Name.Data = pSVar9 + 2;
          Name.Length = pSVar9->StrLen;
          addLiteralOption(this,Opt,sub,Name);
        }
        do {
          do {
            ppSVar12 = ppSVar12 + 1;
            pSVar9 = *ppSVar12;
          } while (pSVar9 == (StringMapEntryBase *)0x0);
        } while (pSVar9 == (StringMapEntryBase *)0xfffffffffffffff8);
      } while (ppSVar12 != ppSVar3 + uVar8);
    }
  }
  return;
}

Assistant:

void registerSubCommand(SubCommand *sub) {
    assert(count_if(RegisteredSubCommands,
                    [sub](const SubCommand *Sub) {
                      return (!sub->getName().empty()) &&
                             (Sub->getName() == sub->getName());
                    }) == 0 &&
           "Duplicate subcommands");
    RegisteredSubCommands.insert(sub);

    // For all options that have been registered for all subcommands, add the
    // option to this subcommand now.
    if (sub != &*AllSubCommands) {
      for (auto &E : AllSubCommands->OptionsMap) {
        Option *O = E.second;
        if ((O->isPositional() || O->isSink() || O->isConsumeAfter()) ||
            O->hasArgStr())
          addOption(O, sub);
        else
          addLiteralOption(*O, sub, E.first());
      }
    }
  }